

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint * Kit_DsdTruthComputeNodeTwo_rec
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp,int iVar,uint *pTruthDec)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  Kit_DsdObj_t *pKVar7;
  uint uVar8;
  char cVar9;
  undefined1 auVar10 [16];
  uint *puVar11;
  uint *puVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Kit_DsdObj_t KVar17;
  int iVar18;
  ulong uVar19;
  ushort uVar20;
  uint uVar21;
  ushort uVar22;
  char cVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar35;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  uint *pTruthFans [16];
  int pfBoundSet [16];
  uint *local_f8 [16];
  uint auStack_78 [18];
  long lVar40;
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x35d,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if (Id < 0) {
LAB_005d3d81:
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  uVar1 = pNtk->nVars;
  uVar24 = (uint)pNtk->nNodes + (uint)uVar1;
  if (uVar24 <= (uint)Id) goto LAB_005d3d81;
  if ((uint)Id < (uint)uVar1) {
    if (Id < p->vTtNodes->nSize) {
      return (uint *)p->vTtNodes->pArray[(uint)Id];
    }
LAB_005d3dbf:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (p->vTtNodes->nSize <= Id) goto LAB_005d3dbf;
  pKVar7 = pNtk->pNodes[(int)(Id - (uint)uVar1)];
  if (pKVar7 == (Kit_DsdObj_t *)0x0) {
    __assert_fail("Id < pNtk->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x364,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  KVar17 = *pKVar7;
  uVar21 = (uint)KVar17 >> 6;
  if ((uVar21 & 7) == 1) {
    __assert_fail("pObj->Type != KIT_DSD_CONST1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x367,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if ((uVar21 & 7) == 2) {
    __assert_fail("pObj->Type != KIT_DSD_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x368,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if ((uint)KVar17 < 0x4000000) {
LAB_005d3108:
    puVar11 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,Id,0);
    return puVar11;
  }
  puVar11 = (uint *)p->vTtNodes->pArray[(uint)Id];
  uVar8 = (uint)KVar17 >> 0x1a;
  uVar28 = (ulong)uVar8;
  uVar26 = 0;
  uVar25 = 0;
  uVar27 = 0;
  do {
    uVar20 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar26 * 2) >> 1;
    if (uVar24 <= uVar20) goto LAB_005d3d62;
    if (pNtk->pSupps == (uint *)0x0) {
      uVar14 = 0;
    }
    else if (uVar20 < uVar1) {
      uVar14 = 1 << ((byte)uVar20 & 0x1f);
    }
    else {
      uVar14 = pNtk->pSupps[(int)((uint)uVar20 - (uint)uVar1)];
    }
    uVar15 = uVar14 & uSupp;
    uVar16 = uVar15;
    if (uVar15 != 0) {
      uVar16 = uVar14;
    }
    uVar27 = uVar27 + (uVar15 != 0);
    uVar25 = uVar25 | uVar16;
    uVar26 = uVar26 + 1;
  } while (uVar28 != uVar26);
  if ((uVar27 == 0) || (uVar27 == uVar8)) goto LAB_005d3108;
  if ((uVar25 & ~uSupp) != 0) {
    if (uVar27 != 1) {
      __assert_fail("nPartial == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x380,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    if (0x3ffffff < (uint)KVar17) {
      uVar28 = 0;
      do {
        uVar20 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar28 * 2) >> 1;
        uVar24 = (uint)uVar20;
        uVar1 = pNtk->nVars;
        if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar24) goto LAB_005d3d62;
        if (pNtk->pSupps == (uint *)0x0) {
          uVar21 = 0;
        }
        else if (uVar20 < uVar1) {
          uVar21 = 1 << ((byte)uVar20 & 0x1f);
        }
        else {
          uVar21 = pNtk->pSupps[(ulong)uVar24 - (ulong)uVar1];
        }
        if ((uVar21 & uSupp) == 0) {
          puVar12 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar24,0);
        }
        else {
          puVar12 = Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,uVar24,uSupp,iVar,pTruthDec);
        }
        local_f8[uVar28] = puVar12;
        uVar28 = uVar28 + 1;
        KVar17 = *pKVar7;
      } while (uVar28 < (uint)KVar17 >> 0x1a);
      uVar21 = (uint)KVar17 >> 6;
    }
    uVar21 = uVar21 & 7;
    if (uVar21 != 5) {
      if (uVar21 != 4) {
        if (uVar21 != 3) {
          __assert_fail("pObj->Type == KIT_DSD_PRIME",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x39f,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        uVar2 = pNtk->nVars;
        uVar24 = 1 << ((char)uVar2 - 5U & 0x1f);
        if ((ushort)uVar2 < 6) {
          uVar24 = 1;
        }
        if (0 < (int)uVar24) {
          memset(puVar11,0xff,(ulong)uVar24 * 4);
          KVar17 = *pKVar7;
        }
        if ((uint)KVar17 < 0x4000000) {
          return puVar11;
        }
        uVar26 = (ulong)uVar24 + 1;
        uVar28 = 0;
        do {
          puVar12 = local_f8[uVar28];
          if ((*(byte *)((long)&pKVar7[1].field_0x0 + uVar28 * 2) & 1) == 0) {
            uVar19 = uVar26;
            if (0 < (int)uVar24) {
              do {
                puVar11[uVar19 - 2] = puVar11[uVar19 - 2] & puVar12[uVar19 - 2];
                uVar19 = uVar19 - 1;
              } while (1 < uVar19);
            }
          }
          else {
            uVar19 = uVar26;
            if (0 < (int)uVar24) {
              do {
                puVar11[uVar19 - 2] = puVar11[uVar19 - 2] & ~puVar12[uVar19 - 2];
                uVar19 = uVar19 - 1;
              } while (1 < uVar19);
            }
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (uint)*pKVar7 >> 0x1a);
        return puVar11;
      }
      uVar3 = pNtk->nVars;
      uVar24 = 1 << ((char)uVar3 - 5U & 0x1f);
      if ((ushort)uVar3 < 6) {
        uVar24 = 1;
      }
      uVar28 = (ulong)uVar24;
      if (0 < (int)uVar24) {
        memset(puVar11,0,uVar28 * 4);
        KVar17 = *pKVar7;
      }
      uVar26 = (ulong)(uint)KVar17;
      if ((uint)KVar17 < 0x4000000) {
        return puVar11;
      }
      uVar19 = 0;
      uVar1 = 0;
      do {
        uVar22 = uVar1;
        uVar20 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar19 * 2);
        if (0 < (int)uVar24) {
          puVar12 = local_f8[uVar19];
          uVar26 = uVar28 + 1;
          do {
            puVar11[uVar26 - 2] = puVar11[uVar26 - 2] ^ puVar12[uVar26 - 2];
            uVar26 = uVar26 - 1;
          } while (1 < uVar26);
          uVar26 = (ulong)(uint)*pKVar7;
        }
        uVar20 = uVar20 & 1;
        uVar19 = uVar19 + 1;
        uVar1 = uVar22 ^ uVar20;
      } while (uVar19 < uVar26 >> 0x1a);
      if ((int)uVar24 < 1) {
        return puVar11;
      }
      if (uVar22 == uVar20) {
        return puVar11;
      }
      uVar28 = uVar28 + 1;
      do {
        puVar11[uVar28 - 2] = ~puVar11[uVar28 - 2];
        uVar28 = uVar28 - 1;
      } while (1 < uVar28);
      return puVar11;
    }
LAB_005d3c80:
    KVar17 = *pKVar7;
    if ((uint)KVar17 < 0x4000000) {
      uVar24 = (uint)KVar17 >> 0x1a;
    }
    else {
      uVar28 = 0;
      do {
        if ((*(byte *)((long)&pKVar7[1].field_0x0 + uVar28 * 2) & 1) != 0) {
          uVar4 = pNtk->nVars;
          uVar24 = 1 << ((char)uVar4 - 5U & 0x1f);
          if ((ushort)uVar4 < 6) {
            uVar24 = 1;
          }
          if (0 < (int)uVar24) {
            puVar12 = local_f8[uVar28];
            uVar26 = (ulong)uVar24 + 1;
            do {
              puVar12[uVar26 - 2] = ~puVar12[uVar26 - 2];
              uVar26 = uVar26 - 1;
            } while (1 < uVar26);
            KVar17 = *pKVar7;
          }
        }
        uVar28 = uVar28 + 1;
        uVar24 = (uint)KVar17 >> 0x1a;
      } while (uVar28 < uVar24);
    }
    puVar12 = (uint *)0x0;
    if (((uint)KVar17 & 0x1c0) == 0x140) {
      puVar12 = (uint *)((long)&pKVar7[1].field_0x0 + (ulong)((uint)KVar17 >> 8 & 0x3fc));
    }
    puVar12 = Kit_TruthCompose(p->dd,puVar12,uVar24,local_f8,(uint)pNtk->nVars,p->vTtBdds,p->vNodes)
    ;
    uVar5 = pNtk->nVars;
    uVar24 = 1 << ((char)uVar5 - 5U & 0x1f);
    if ((ushort)uVar5 < 6) {
      uVar24 = 1;
    }
    if ((int)uVar24 < 1) {
      return puVar11;
    }
    uVar28 = (ulong)uVar24 + 1;
    do {
      puVar11[uVar28 - 2] = puVar12[uVar28 - 2];
      uVar28 = uVar28 - 1;
    } while (1 < uVar28);
    return puVar11;
  }
  if (uVar8 <= uVar27) {
    __assert_fail("nPartial < pObj->nFans",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x3a4,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if (0x3ffffff < (uint)KVar17) {
    uVar26 = 0;
    do {
      uVar20 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar26 * 2) >> 1;
      uVar24 = (uint)uVar20;
      puVar12 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar24,0);
      local_f8[uVar26] = puVar12;
      uVar1 = pNtk->nVars;
      if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar24) {
LAB_005d3d62:
        __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                      ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
      }
      if (pNtk->pSupps == (uint *)0x0) {
        uVar24 = 0;
      }
      else if (uVar20 < uVar1) {
        uVar24 = 1 << ((byte)uVar20 & 0x1f);
      }
      else {
        uVar24 = pNtk->pSupps[(int)(uVar24 - uVar1)];
      }
      auStack_78[uVar26] = (uint)((uVar24 & uSupp) != 0);
      uVar26 = uVar26 + 1;
      uVar28 = (ulong)((uint)*pKVar7 >> 0x1a);
    } while (uVar26 < uVar28);
    uVar21 = (uint)*pKVar7 >> 6;
  }
  auVar10 = _DAT_0093d220;
  uVar21 = uVar21 & 7;
  cVar9 = (char)uVar1;
  cVar23 = (char)iVar;
  if (uVar21 == 5) {
    if (uVar27 != 1) {
      __assert_fail("nPartial == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x3cd,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    if ((int)uVar28 != 0) {
      uVar26 = 0;
      do {
        if (auStack_78[uVar26] != 0) {
          uVar28 = (ulong)(uint)(1 << (cVar9 - 5U & 0x1f));
          if (uVar1 < 6) {
            uVar28 = 1;
          }
          iVar18 = (int)uVar28;
          if (0 < iVar18) {
            puVar12 = local_f8[uVar26];
            uVar26 = uVar28 + 1;
            do {
              pTruthDec[uVar26 - 2] = puVar12[uVar26 - 2];
              auVar10 = _DAT_0093d220;
              uVar26 = uVar26 - 1;
            } while (1 < uVar26);
            if (iVar < 5) {
              uVar6 = (&DAT_009fea40)[iVar];
              lVar13 = uVar28 - 1;
              auVar31._8_4_ = (int)lVar13;
              auVar31._0_8_ = lVar13;
              auVar31._12_4_ = (int)((ulong)lVar13 >> 0x20);
              lVar13 = 0;
              auVar31 = auVar31 ^ _DAT_0093d220;
              auVar44 = _DAT_0093e4e0;
              auVar43 = _DAT_0093d210;
              do {
                auVar45 = auVar43 ^ auVar10;
                iVar35 = auVar31._4_4_;
                if ((bool)(~(auVar45._4_4_ == iVar35 && auVar31._0_4_ < auVar45._0_4_ ||
                            iVar35 < auVar45._4_4_) & 1)) {
                  *(undefined4 *)((long)puVar12 + lVar13) = uVar6;
                }
                if ((auVar45._12_4_ != auVar31._12_4_ || auVar45._8_4_ <= auVar31._8_4_) &&
                    auVar45._12_4_ <= auVar31._12_4_) {
                  *(undefined4 *)((long)puVar12 + lVar13 + 4) = uVar6;
                }
                iVar46 = SUB164(auVar44 ^ auVar10,4);
                if (iVar46 <= iVar35 &&
                    (iVar46 != iVar35 || SUB164(auVar44 ^ auVar10,0) <= auVar31._0_4_)) {
                  *(undefined4 *)((long)puVar12 + lVar13 + 8) = uVar6;
                  *(undefined4 *)((long)puVar12 + lVar13 + 0xc) = uVar6;
                }
                lVar40 = auVar43._8_8_;
                auVar43._0_8_ = auVar43._0_8_ + 4;
                auVar43._8_8_ = lVar40 + 4;
                lVar40 = auVar44._8_8_;
                auVar44._0_8_ = auVar44._0_8_ + 4;
                auVar44._8_8_ = lVar40 + 4;
                lVar13 = lVar13 + 0x10;
              } while ((ulong)(iVar18 + 3U >> 2) << 4 != lVar13);
            }
            else {
              uVar24 = 1 << (cVar23 - 5U & 0x1f);
              lVar13 = uVar28 - 1;
              auVar34._8_4_ = (int)lVar13;
              auVar34._0_8_ = lVar13;
              auVar34._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar28 = 0;
              auVar34 = auVar34 ^ _DAT_0093d220;
              auVar45 = _DAT_0093d210;
              do {
                auVar44 = auVar45 ^ auVar10;
                if ((bool)(~(auVar44._4_4_ == auVar34._4_4_ && auVar34._0_4_ < auVar44._0_4_ ||
                            auVar34._4_4_ < auVar44._4_4_) & 1)) {
                  puVar12[uVar28] = -(uint)((uVar24 & (uint)uVar28) != 0);
                }
                if ((auVar44._12_4_ != auVar34._12_4_ || auVar44._8_4_ <= auVar34._8_4_) &&
                    auVar44._12_4_ <= auVar34._12_4_) {
                  puVar12[uVar28 + 1] = -(uint)(((uint)uVar28 + 1 & uVar24) != 0);
                }
                uVar28 = uVar28 + 2;
                lVar13 = auVar45._8_8_;
                auVar45._0_8_ = auVar45._0_8_ + 2;
                auVar45._8_8_ = lVar13 + 2;
              } while ((iVar18 + 1U & 0xfffffffe) != uVar28);
            }
          }
          goto LAB_005d3c80;
        }
        uVar26 = uVar26 + 1;
      } while (uVar28 != uVar26);
    }
    __assert_fail("i < pObj->nFans",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x3d3,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if (uVar21 == 4) {
    uVar24 = 1 << (cVar9 - 5U & 0x1f);
    if (uVar1 < 6) {
      uVar24 = 1;
    }
    uVar28 = (ulong)uVar24;
    if (iVar < 5) {
      if ((int)uVar24 < 1) goto LAB_005d3992;
      uVar6 = (&DAT_009fea40)[iVar];
      lVar13 = uVar28 - 1;
      auVar30._8_4_ = (int)lVar13;
      auVar30._0_8_ = lVar13;
      auVar30._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar13 = 0;
      auVar30 = auVar30 ^ _DAT_0093d220;
      auVar37 = _DAT_0093e4e0;
      auVar42 = _DAT_0093d210;
      do {
        auVar45 = auVar42 ^ auVar10;
        iVar18 = auVar30._4_4_;
        if ((bool)(~(auVar45._4_4_ == iVar18 && auVar30._0_4_ < auVar45._0_4_ ||
                    iVar18 < auVar45._4_4_) & 1)) {
          *(undefined4 *)((long)puVar11 + lVar13) = uVar6;
        }
        if ((auVar45._12_4_ != auVar30._12_4_ || auVar45._8_4_ <= auVar30._8_4_) &&
            auVar45._12_4_ <= auVar30._12_4_) {
          *(undefined4 *)((long)puVar11 + lVar13 + 4) = uVar6;
        }
        iVar35 = SUB164(auVar37 ^ auVar10,4);
        if (iVar35 <= iVar18 && (iVar35 != iVar18 || SUB164(auVar37 ^ auVar10,0) <= auVar30._0_4_))
        {
          *(undefined4 *)((long)puVar11 + lVar13 + 8) = uVar6;
          *(undefined4 *)((long)puVar11 + lVar13 + 0xc) = uVar6;
        }
        lVar40 = auVar42._8_8_;
        auVar42._0_8_ = auVar42._0_8_ + 4;
        auVar42._8_8_ = lVar40 + 4;
        lVar40 = auVar37._8_8_;
        auVar37._0_8_ = auVar37._0_8_ + 4;
        auVar37._8_8_ = lVar40 + 4;
        lVar13 = lVar13 + 0x10;
      } while ((ulong)(uVar24 + 3 >> 2) << 4 != lVar13);
    }
    else {
      if ((int)uVar24 < 1) goto LAB_005d3992;
      uVar21 = 1 << (cVar23 - 5U & 0x1f);
      lVar13 = uVar28 - 1;
      auVar32._8_4_ = (int)lVar13;
      auVar32._0_8_ = lVar13;
      auVar32._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar26 = 0;
      auVar32 = auVar32 ^ _DAT_0093d220;
      auVar38 = _DAT_0093d210;
      do {
        auVar45 = auVar38 ^ auVar10;
        if ((bool)(~(auVar45._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar45._0_4_ ||
                    auVar32._4_4_ < auVar45._4_4_) & 1)) {
          puVar11[uVar26] = -(uint)((uVar21 & (uint)uVar26) != 0);
        }
        if ((auVar45._12_4_ != auVar32._12_4_ || auVar45._8_4_ <= auVar32._8_4_) &&
            auVar45._12_4_ <= auVar32._12_4_) {
          puVar11[uVar26 + 1] = -(uint)(((uint)uVar26 + 1 & uVar21) != 0);
        }
        uVar26 = uVar26 + 2;
        lVar13 = auVar38._8_8_;
        auVar38._0_8_ = auVar38._0_8_ + 2;
        auVar38._8_8_ = lVar13 + 2;
      } while ((uVar24 + 1 & 0xfffffffe) != uVar26);
    }
    if (0 < (int)uVar24) {
      memset(pTruthDec,0,uVar28 << 2);
    }
LAB_005d3992:
    if ((uint)*pKVar7 < 0x4000000) {
      return puVar11;
    }
    uVar26 = 0;
    uVar1 = 0;
    do {
      uVar22 = uVar1;
      uVar20 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar26 * 2);
      puVar12 = local_f8[uVar26];
      if (auStack_78[uVar26] == 0) {
        uVar19 = uVar28 + 1;
        if (0 < (int)uVar24) {
          do {
            puVar11[uVar19 - 2] = puVar11[uVar19 - 2] ^ puVar12[uVar19 - 2];
            uVar19 = uVar19 - 1;
          } while (1 < uVar19);
        }
      }
      else {
        uVar19 = uVar28 + 1;
        if (0 < (int)uVar24) {
          do {
            pTruthDec[uVar19 - 2] = pTruthDec[uVar19 - 2] ^ puVar12[uVar19 - 2];
            uVar19 = uVar19 - 1;
          } while (1 < uVar19);
        }
      }
      uVar20 = uVar20 & 1;
      uVar26 = uVar26 + 1;
      uVar1 = uVar22 ^ uVar20;
    } while (uVar26 < (uint)*pKVar7 >> 0x1a);
    if (uVar22 == uVar20) {
      return puVar11;
    }
    if ((int)uVar24 < 1) {
      return puVar11;
    }
    uVar28 = uVar28 + 1;
    do {
      puVar11[uVar28 - 2] = ~puVar11[uVar28 - 2];
      uVar28 = uVar28 - 1;
    } while (1 < uVar28);
    return puVar11;
  }
  if (uVar21 != 3) {
    __assert_fail("pObj->Type == KIT_DSD_PRIME",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x3cc,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  uVar24 = 1 << (cVar9 - 5U & 0x1f);
  if (uVar1 < 6) {
    uVar24 = 1;
  }
  uVar28 = (ulong)uVar24;
  if (iVar < 5) {
    if ((int)uVar24 < 1) goto LAB_005d3b11;
    uVar6 = (&DAT_009fea40)[iVar];
    lVar13 = uVar28 - 1;
    auVar29._8_4_ = (int)lVar13;
    auVar29._0_8_ = lVar13;
    auVar29._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar29 = auVar29 ^ _DAT_0093d220;
    auVar36 = _DAT_0093e4e0;
    auVar41 = _DAT_0093d210;
    do {
      auVar45 = auVar41 ^ auVar10;
      iVar18 = auVar29._4_4_;
      if ((bool)(~(auVar45._4_4_ == iVar18 && auVar29._0_4_ < auVar45._0_4_ ||
                  iVar18 < auVar45._4_4_) & 1)) {
        *(undefined4 *)((long)puVar11 + lVar13) = uVar6;
      }
      if ((auVar45._12_4_ != auVar29._12_4_ || auVar45._8_4_ <= auVar29._8_4_) &&
          auVar45._12_4_ <= auVar29._12_4_) {
        *(undefined4 *)((long)puVar11 + lVar13 + 4) = uVar6;
      }
      iVar35 = SUB164(auVar36 ^ auVar10,4);
      if (iVar35 <= iVar18 && (iVar35 != iVar18 || SUB164(auVar36 ^ auVar10,0) <= auVar29._0_4_)) {
        *(undefined4 *)((long)puVar11 + lVar13 + 8) = uVar6;
        *(undefined4 *)((long)puVar11 + lVar13 + 0xc) = uVar6;
      }
      lVar40 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 4;
      auVar41._8_8_ = lVar40 + 4;
      lVar40 = auVar36._8_8_;
      auVar36._0_8_ = auVar36._0_8_ + 4;
      auVar36._8_8_ = lVar40 + 4;
      lVar13 = lVar13 + 0x10;
    } while ((ulong)(uVar24 + 3 >> 2) << 4 != lVar13);
  }
  else {
    if ((int)uVar24 < 1) goto LAB_005d3b11;
    uVar21 = 1 << (cVar23 - 5U & 0x1f);
    lVar13 = uVar28 - 1;
    auVar33._8_4_ = (int)lVar13;
    auVar33._0_8_ = lVar13;
    auVar33._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar26 = 0;
    auVar33 = auVar33 ^ _DAT_0093d220;
    auVar39 = _DAT_0093d210;
    do {
      auVar45 = auVar39 ^ auVar10;
      if ((bool)(~(auVar45._4_4_ == auVar33._4_4_ && auVar33._0_4_ < auVar45._0_4_ ||
                  auVar33._4_4_ < auVar45._4_4_) & 1)) {
        puVar11[uVar26] = -(uint)((uVar21 & (uint)uVar26) != 0);
      }
      if ((auVar45._12_4_ != auVar33._12_4_ || auVar45._8_4_ <= auVar33._8_4_) &&
          auVar45._12_4_ <= auVar33._12_4_) {
        puVar11[uVar26 + 1] = -(uint)(((uint)uVar26 + 1 & uVar21) != 0);
      }
      uVar26 = uVar26 + 2;
      lVar13 = auVar39._8_8_;
      auVar39._0_8_ = auVar39._0_8_ + 2;
      auVar39._8_8_ = lVar13 + 2;
    } while ((uVar24 + 1 & 0xfffffffe) != uVar26);
  }
  if (0 < (int)uVar24) {
    memset(pTruthDec,0xff,uVar28 << 2);
  }
LAB_005d3b11:
  if (0x3ffffff < (uint)*pKVar7) {
    uVar28 = uVar28 + 1;
    uVar26 = 0;
    do {
      uVar1 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar26 * 2);
      puVar12 = local_f8[uVar26];
      if (auStack_78[uVar26] == 0) {
        if ((uVar1 & 1) == 0) {
          uVar19 = uVar28;
          if (0 < (int)uVar24) {
            do {
              puVar11[uVar19 - 2] = puVar11[uVar19 - 2] & puVar12[uVar19 - 2];
              uVar19 = uVar19 - 1;
            } while (1 < uVar19);
          }
        }
        else {
          uVar19 = uVar28;
          if (0 < (int)uVar24) {
            do {
              puVar11[uVar19 - 2] = puVar11[uVar19 - 2] & ~puVar12[uVar19 - 2];
              uVar19 = uVar19 - 1;
            } while (1 < uVar19);
          }
        }
      }
      else if ((uVar1 & 1) == 0) {
        uVar19 = uVar28;
        if (0 < (int)uVar24) {
          do {
            pTruthDec[uVar19 - 2] = pTruthDec[uVar19 - 2] & puVar12[uVar19 - 2];
            uVar19 = uVar19 - 1;
          } while (1 < uVar19);
        }
      }
      else {
        uVar19 = uVar28;
        if (0 < (int)uVar24) {
          do {
            pTruthDec[uVar19 - 2] = pTruthDec[uVar19 - 2] & ~puVar12[uVar19 - 2];
            uVar19 = uVar19 - 1;
          } while (1 < uVar19);
        }
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (uint)*pKVar7 >> 0x1a);
  }
  return puVar11;
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeTwo_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    Kit_DsdObj_t * pObj;
    int pfBoundSet[16];
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial, uSuppFan, uSuppCur;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 
    assert( uSupp > 0 );

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type != KIT_DSD_CONST1 );
    assert( pObj->Type != KIT_DSD_VAR );

    // count the number of intersecting fanins 
    // collect the total support of the intersecting fanins
    nPartial = 0;
    uSuppFan = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        uSuppCur = Kit_DsdLitSupport(pNtk, iLit);
        if ( uSupp & uSuppCur )
        {
            nPartial++;
            uSuppFan |= uSuppCur;
        }
    }

    // if there is no intersection, or full intersection, use simple procedure
    if ( nPartial == 0 || nPartial == pObj->nFans )
        return Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Id, 0 );

    // if support of the component includes some other variables
    // we need to continue constructing it as usual by the two-function procedure
    if ( uSuppFan != (uSuppFan & uSupp) )
    {
        assert( nPartial == 1 );
//        return Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Id, uSupp, iVar, pTruthDec );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( uSupp & Kit_DsdLitSupport(pNtk, iLit) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp, iVar, pTruthDec );
            else
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthFill( pTruthRes, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthClear( pTruthRes, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
    }
    else
    {
        assert( uSuppFan == (uSuppFan & uSupp) );
        assert( nPartial < pObj->nFans );
        // the support of the insecting component(s) is contained in the bound-set
        // and yet there are components that are not contained in the bound set

        // solve the fanins and collect info, which components belong to the bound set
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
            pfBoundSet[i] = (int)((uSupp & Kit_DsdLitSupport(pNtk, iLit)) > 0);
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthFill( pTruthDec, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                if ( pfBoundSet[i] )
                    Kit_TruthAndPhase( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
                else
                    Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthClear( pTruthDec, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                if ( pfBoundSet[i] )
                    Kit_TruthXor( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars );
                else
                    Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
        assert( nPartial == 1 );

        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pfBoundSet[i] )
                break;
        assert( i < pObj->nFans );

        // save this component as the decomposed function
        Kit_TruthCopy( pTruthDec, pTruthFans[i], pNtk->nVars );
        // set the corresponding component to be the new variable
        Kit_TruthIthVar( pTruthFans[i], pNtk->nVars, iVar );
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
//    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
//        assert( !Abc_LitIsCompl(iLit) );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}